

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lab_employees.cpp
# Opt level: O2

void __thiscall lab_employees::getGroups(lab_employees *this)

{
  ostream *this_00;
  ulong uVar1;
  
  this_00 = std::operator<<((ostream *)&std::cout,"\n\tNumber of Groups : ");
  std::ostream::operator<<(this_00,(this->super_Person).num_groups);
  std::operator<<((ostream *)&std::cout,"\n\t Groups : ");
  uVar1 = 0;
  while ((long)uVar1 < (long)(this->super_Person).num_groups) {
    std::ostream::operator<<((ostream *)&std::cout,(this->super_Person).groups[uVar1]);
    uVar1 = uVar1 + 1;
    if (uVar1 != (uint)(this->super_Person).num_groups) {
      std::operator<<((ostream *)&std::cout,", ");
    }
  }
  return;
}

Assistant:

void lab_employees::getGroups(){

    cout<<"\n\tNumber of Groups : "<<this->num_groups;
    cout<<"\n\t Groups : ";
    for(int i=0;i<this->num_groups;i++){
        cout<<this->groups[i];
        if(i+1 != this->num_groups){
            cout<<", ";
        }
    }


}